

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int row;
  int col;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  
  system("clear");
  if (argc < 2) {
    pcVar4 = "Too few arguments!\n";
    lVar3 = 0x13;
  }
  else if ((uint)argc < 7) {
    if (argc == 2) {
      iVar1 = atoi(argv[1]);
      if (iVar1 - 0x65U < 0xffffff9c) goto LAB_001024ff;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nUsing default number for rows and columns: 10x10\n\n",0x33
                );
LAB_00102554:
      row = 10;
      col = 10;
LAB_0010255a:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number of puzzles: ",0x13);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number of rows: ",0x10);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,row);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Number of columns: ",0x13);
      plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,col);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      puzzle_Generator(row,col,iVar1);
      return 0;
    }
    row = atoi(argv[2]);
    if (row - 0x11U < 0xfffffff6) {
      pcVar4 = "Number of rows is out of range!\n";
      lVar3 = 0x20;
    }
    else {
      col = atoi(argv[4]);
      if (0xfffffff5 < col - 0x11U) {
        iVar1 = strcmp(argv[1],"--rows");
        if ((iVar1 != 0) || (iVar1 = strcmp(argv[3],"--cols"), iVar1 != 0)) goto LAB_001024ff;
        if (argc == 6) {
          iVar1 = atoi(argv[5]);
          if (iVar1 - 0x65U < 0xffffff9c) goto LAB_001024ff;
          goto LAB_0010255a;
        }
        iVar1 = 1;
        goto LAB_00102554;
      }
      pcVar4 = "Number of columns is out of range!\n";
      lVar3 = 0x23;
    }
  }
  else {
    pcVar4 = "Too many arguments!\n";
    lVar3 = 0x14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
LAB_001024ff:
  printHelp();
  return 1;
}

Assistant:

int main ( int argc, char const *argv[])
{
    system("clear");

    int puzzles = NPUZZLE; //! Number of puzzles
    int rows = DFT_ROW; //! Number of rows
    int columns = DFT_COL; //! Number of columns

	//! Verifies the valid amount of arguments to the program's execution
    if( argc < 2 )
    {
        std::cout << "Too few arguments!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    }
    else if( argc > 6 )
    {
        std::cout << "Too many arguments!\n" << std::endl;
        printHelp();
        return EXIT_FAILURE;
    }

	/*! If the amount of arguments is equal to 2 (<executable> [number of puzzles]),
	 *  puzzles receives the value of argv[1]
	 */
    else if( argc == 2 )
    {
        puzzles = atoi(argv[1]);

        if( puzzles < 1 or puzzles > 100 )
        {
            printHelp();
            return EXIT_FAILURE;
        }

        std::cout << "\nUsing default number for rows and columns: 10x10\n\n";
    }
	//* Verifies the interval of values allowed for rows and columns
    else if( atoi(argv[2]) < MIN_ROW or atoi(argv[2]) > MAX_ROW )
    {
        std::cout << "Number of rows is out of range!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    }
    else if( atoi(argv[4]) < MIN_COL or atoi(argv[4]) > MAX_COL )
    {
        std::cout << "Number of columns is out of range!\n" << std::endl;
        printHelp();

        return EXIT_FAILURE;
    } 
	//* Verifies if the user entered the right arguments to inform the rows and columns
    else if( strcmp( argv[1], "--rows" ) != 0 or strcmp( argv[3], "--cols" ) != 0 ) 
	{
        printHelp();

        return EXIT_FAILURE;
    }
	/*! Last verification. If everything's fine, the values of the
	 *  parameters are assigned
	 */ 
    else if( argc == 6 and ( strcmp( argv[1], "--rows" ) == 0 ) and ( strcmp( argv[3], "--cols" ) == 0 ) )
	{
        puzzles = atoi(argv[5]);

        if( puzzles < 1 or puzzles > 100 )
        {
            printHelp();

            return EXIT_FAILURE;
        }

        rows = atoi(argv[2]);
        columns = atoi(argv[4]);
    }

    std::cout << "Number of puzzles: " << puzzles << std::endl;
    std::cout << "Number of rows: " << rows << std::endl;
    std::cout << "Number of columns: " << columns << std::endl;

    puzzle_Generator( rows, columns, puzzles );

    return EXIT_SUCCESS;
 }